

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O2

void verify_heap_entries(VMEMcache *cache,stat_t entries)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  long local_20;
  stat_t stat;
  
  iVar1 = vmemcache_get_stat(cache,8,&local_20,8);
  if (iVar1 == -1) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0xc3,"verify_heap_entries");
    __stream = _stderr;
    uVar2 = vmemcache_errormsg();
    fprintf(__stream,"vmemcache_get_stat: %s",uVar2);
  }
  else {
    if (local_20 == 1) {
      return;
    }
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,199,"verify_heap_entries");
    fprintf(_stderr,"vmemcache_get_stat: wrong statistic\'s (%s) value: %llu (should be %llu)",
            "HEAP_ENTRIES",local_20,1);
  }
  fputc(10,_stderr);
  abort();
}

Assistant:

static void
verify_heap_entries(VMEMcache *cache, stat_t entries)
{
#ifdef STATS_ENABLED
	stat_t stat;
	int ret;

	ret = vmemcache_get_stat(cache, VMEMCACHE_STAT_HEAP_ENTRIES,
			&stat, sizeof(stat));
	if (ret == -1)
		UT_FATAL("vmemcache_get_stat: %s", vmemcache_errormsg());
	if (stat != entries)
		UT_FATAL(
			"vmemcache_get_stat: wrong statistic's (%s) value: %llu (should be %llu)",
			stat_str[VMEMCACHE_STAT_HEAP_ENTRIES], stat, entries);
#endif
}